

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

int Abc_SopGetCubeNum(char *pSop)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  
  iVar1 = 0;
  if ((pSop != (char *)0x0) && (cVar2 = *pSop, iVar1 = 0, cVar2 != '\0')) {
    pcVar3 = pSop + 1;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(cVar2 == '\n');
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return iVar1;
}

Assistant:

int Abc_SopGetCubeNum( char * pSop )
{
    char * pCur;
    int nCubes = 0;
    if ( pSop == NULL )
        return 0;
    for ( pCur = pSop; *pCur; pCur++ )
        nCubes += (*pCur == '\n');
    return nCubes;
}